

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O3

ON_3dmRenderSettings * __thiscall
ON_3dmRenderSettings::operator=(ON_3dmRenderSettings *this,ON_3dmRenderSettings *rs)

{
  ON_3dmRenderSettingsPrivate *p;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  unsigned_short uVar9;
  unsigned_short uVar10;
  int iVar11;
  ON_3dmRenderSettingsPrivate *pOVar12;
  
  if (this != rs) {
    ON_Object::operator=(&this->super_ON_Object,&rs->super_ON_Object);
    p = rs->m_private;
    pOVar12 = this->m_private;
    if (p == (ON_3dmRenderSettingsPrivate *)0x0) {
      if (pOVar12 != (ON_3dmRenderSettingsPrivate *)0x0) {
        ON_3dmRenderSettingsPrivate::SetToDefaults(pOVar12);
      }
    }
    else if (pOVar12 == (ON_3dmRenderSettingsPrivate *)0x0) {
      pOVar12 = (ON_3dmRenderSettingsPrivate *)operator_new(0x148);
      ON_3dmRenderSettingsPrivate::ON_3dmRenderSettingsPrivate(pOVar12,p);
      this->m_private = pOVar12;
    }
    else {
      ON_3dmRenderSettingsPrivate::operator=(pOVar12,p);
    }
    (this->m_ambient_light).field_0 = (rs->m_ambient_light).field_0;
    this->m_antialias_style = rs->m_antialias_style;
    ON_wString::operator=(&this->m_background_bitmap_filename,&rs->m_background_bitmap_filename);
    (this->m_background_bottom_color).field_0 = (rs->m_background_bottom_color).field_0;
    (this->m_background_color).field_0 = (rs->m_background_color).field_0;
    this->m_background_style = rs->m_background_style;
    this->m_bCustomImageSize = rs->m_bCustomImageSize;
    this->m_bForceViewportAspectRatio = rs->m_bForceViewportAspectRatio;
    this->m_bRenderAnnotation = rs->m_bRenderAnnotation;
    this->m_bScaleBackgroundToFit = rs->m_bScaleBackgroundToFit;
    this->m_bTransparentBackground = rs->m_bTransparentBackground;
    bVar2 = rs->m_bDepthCue;
    bVar3 = rs->m_bFlatShade;
    bVar4 = rs->m_bRenderBackfaces;
    bVar5 = rs->m_bRenderPoints;
    bVar6 = rs->m_bRenderCurves;
    bVar7 = rs->m_bRenderIsoparams;
    bVar8 = rs->m_bRenderMeshEdges;
    this->m_bUseHiddenLights = rs->m_bUseHiddenLights;
    this->m_bDepthCue = bVar2;
    this->m_bFlatShade = bVar3;
    this->m_bRenderBackfaces = bVar4;
    this->m_bRenderPoints = bVar5;
    this->m_bRenderCurves = bVar6;
    this->m_bRenderIsoparams = bVar7;
    this->m_bRenderMeshEdges = bVar8;
    this->m_bUsesHiddenLightsAttr = rs->m_bUsesHiddenLightsAttr;
    bVar2 = rs->m_bUsesBackgroundAttr;
    bVar3 = rs->m_bUsesBackfaceAttr;
    bVar4 = rs->m_bUsesPointsAttr;
    bVar5 = rs->m_bUsesCurvesAttr;
    bVar6 = rs->m_bUsesIsoparmsAttr;
    bVar7 = rs->m_bUsesMeshEdgesAttr;
    bVar8 = rs->m_bUsesAnnotationAttr;
    this->m_bUsesAmbientAttr = rs->m_bUsesAmbientAttr;
    this->m_bUsesBackgroundAttr = bVar2;
    this->m_bUsesBackfaceAttr = bVar3;
    this->m_bUsesPointsAttr = bVar4;
    this->m_bUsesCurvesAttr = bVar5;
    this->m_bUsesIsoparmsAttr = bVar6;
    this->m_bUsesMeshEdgesAttr = bVar7;
    this->m_bUsesAnnotationAttr = bVar8;
    uVar9 = (rs->m_embedded_image_file_id).Data2;
    uVar10 = (rs->m_embedded_image_file_id).Data3;
    uVar1 = *(undefined8 *)(rs->m_embedded_image_file_id).Data4;
    (this->m_embedded_image_file_id).Data1 = (rs->m_embedded_image_file_id).Data1;
    (this->m_embedded_image_file_id).Data2 = uVar9;
    (this->m_embedded_image_file_id).Data3 = uVar10;
    *(undefined8 *)(this->m_embedded_image_file_id).Data4 = uVar1;
    this->m_image_dpi = rs->m_image_dpi;
    this->m_image_height = rs->m_image_height;
    this->m_image_us = rs->m_image_us;
    this->m_image_width = rs->m_image_width;
    ON_wString::operator=(&this->m_named_view,&rs->m_named_view);
    this->m_rendering_source = rs->m_rendering_source;
    this->m_reserved1 = rs->m_reserved1;
    this->m_reserved3 = rs->m_reserved3;
    this->m_reserved4 = rs->m_reserved4;
    this->m_reserved5 = rs->m_reserved5;
    this->m_reserved6 = rs->m_reserved6;
    uVar9 = rs->m_reserved8;
    this->m_reserved7 = rs->m_reserved7;
    this->m_reserved8 = uVar9;
    this->m_shadowmap_height = rs->m_shadowmap_height;
    this->m_shadowmap_offset = rs->m_shadowmap_offset;
    iVar11 = rs->m_shadowmap_width;
    this->m_shadowmap_style = rs->m_shadowmap_style;
    this->m_shadowmap_width = iVar11;
    ON_wString::operator=(&this->m_snapshot,&rs->m_snapshot);
    ON_wString::operator=(&this->m_specific_viewport,&rs->m_specific_viewport);
  }
  return this;
}

Assistant:

ON_3dmRenderSettings& ON_3dmRenderSettings::operator = (const ON_3dmRenderSettings& rs)
{
  if (this != &rs)
  {
    ON_Object::operator = (rs);

    if (nullptr != rs.m_private)
    {
      if (nullptr == m_private)
      {
        m_private = new ON_3dmRenderSettingsPrivate(*rs.m_private);
      }
      else
      {
        *m_private = *rs.m_private;
      }
    }
    else
    {
      if (nullptr != m_private)
      {
        // We can't delete the private because it might have specialized document objects (gp etc).
        // So don't delete it, but set it to defaults because the incoming one doesn't exist which
        // is essentially the same as the incoming one being an implied default one.
        m_private->SetToDefaults();
      }
    }

    m_ambient_light              = rs.m_ambient_light;
    m_antialias_style            = rs.m_antialias_style;
    m_background_bitmap_filename = rs.m_background_bitmap_filename;
    m_background_bottom_color    = rs.m_background_bottom_color;
    m_background_color           = rs.m_background_color;
    m_background_style           = rs.m_background_style;
    m_bCustomImageSize           = rs.m_bCustomImageSize;
    m_bDepthCue                  = rs.m_bDepthCue;
    m_bFlatShade                 = rs.m_bFlatShade;
    m_bForceViewportAspectRatio  = rs.m_bForceViewportAspectRatio;
    m_bRenderAnnotation          = rs.m_bRenderAnnotation;
    m_bRenderBackfaces           = rs.m_bRenderBackfaces;
    m_bRenderCurves              = rs.m_bRenderCurves;
    m_bRenderIsoparams           = rs.m_bRenderIsoparams;
    m_bRenderMeshEdges           = rs.m_bRenderMeshEdges;
    m_bRenderPoints              = rs.m_bRenderPoints;
    m_bScaleBackgroundToFit      = rs.m_bScaleBackgroundToFit;
    m_bTransparentBackground     = rs.m_bTransparentBackground;
    m_bUseHiddenLights           = rs.m_bUseHiddenLights;
    m_bUsesAmbientAttr           = rs.m_bUsesAmbientAttr;
    m_bUsesAnnotationAttr        = rs.m_bUsesAnnotationAttr;
    m_bUsesBackfaceAttr          = rs.m_bUsesBackfaceAttr;
    m_bUsesBackgroundAttr        = rs.m_bUsesBackgroundAttr;
    m_bUsesCurvesAttr            = rs.m_bUsesCurvesAttr;
    m_bUsesHiddenLightsAttr      = rs.m_bUsesHiddenLightsAttr;
    m_bUsesIsoparmsAttr          = rs.m_bUsesIsoparmsAttr;
    m_bUsesMeshEdgesAttr         = rs.m_bUsesMeshEdgesAttr;
    m_bUsesPointsAttr            = rs.m_bUsesPointsAttr;
    m_embedded_image_file_id     = rs.m_embedded_image_file_id;
    m_image_dpi                  = rs.m_image_dpi;
    m_image_height               = rs.m_image_height;
    m_image_us                   = rs.m_image_us;
    m_image_width                = rs.m_image_width;
    m_named_view                 = rs.m_named_view;
    m_rendering_source           = rs.m_rendering_source;
    m_reserved1                  = rs.m_reserved1;
    m_reserved3                  = rs.m_reserved3;
    m_reserved4                  = rs.m_reserved4;
    m_reserved5                  = rs.m_reserved5;
    m_reserved6                  = rs.m_reserved6;
    m_reserved7                  = rs.m_reserved7;
    m_reserved8                  = rs.m_reserved8;
    m_shadowmap_height           = rs.m_shadowmap_height;
    m_shadowmap_offset           = rs.m_shadowmap_offset;
    m_shadowmap_style            = rs.m_shadowmap_style;
    m_shadowmap_width            = rs.m_shadowmap_width;
    m_snapshot                   = rs.m_snapshot;
    m_specific_viewport          = rs.m_specific_viewport;
  }

  return *this;
}